

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test::~Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test
          (Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1ErrorTest) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  int exponent;
  int mantissa;
  uint64_t min_value;
  uint64_t max_value;
  // empty range_proof
  {
    ByteData range_proof("");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }

  // invalid range_proof
  {
    ByteData range_proof("0000");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
}